

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph.h
# Opt level: O2

uint32_t pgraph_pitch_mask(chipset_info *chipset)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = chipset->card_type;
  uVar2 = 0x1ff0;
  if (((0xf < (int)uVar1) && (uVar2 = 0xfff0, 0x1f < uVar1)) && (chipset->chipset != 0x34)) {
    uVar2 = (uint)(0x3f < uVar1) << 0x10 | 0xffc0;
  }
  return uVar2;
}

Assistant:

static inline uint32_t pgraph_pitch_mask(const struct chipset_info *chipset) {
	if (chipset->card_type < 0x10)
		return 0x1ff0;
	else if (chipset->card_type < 0x20 || chipset->chipset == 0x34)
		return 0xfff0;
	else if (chipset->card_type < 0x40)
		return 0xffc0;
	else
		return 0x1ffc0;
}